

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_GenericField32.c
# Opt level: O1

void Hacl_GenericField32_exp_consttime
               (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,uint32_t *aM,uint32_t bBits,
               uint32_t *b,uint32_t *resM)

{
  uint32_t *puVar1;
  size_t __n;
  size_t __n_00;
  uint uVar2;
  long lVar3;
  uint32_t *puVar4;
  uint32_t *a;
  uint32_t uVar5;
  uint32_t uVar6;
  byte bVar7;
  sbyte sVar8;
  uint uVar9;
  undefined4 in_register_00000014;
  uint32_t *puVar10;
  uint32_t *puVar11;
  uint uVar12;
  uint32_t *puVar13;
  uint uVar14;
  uint32_t *os_15;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint32_t *puVar19;
  uint32_t auStack_110 [4];
  ulong local_100;
  uint32_t *local_f8;
  uint32_t *local_f0;
  uint32_t *local_e8;
  uint32_t *local_e0;
  uint32_t *local_d8;
  uint32_t *local_d0;
  uint32_t *local_c8;
  uint32_t *local_c0;
  uint32_t *local_b8;
  uint32_t *local_b0;
  ulong local_a8;
  uint32_t *local_a0;
  uint32_t *local_98;
  uint32_t *local_90;
  uint32_t *local_88;
  uint32_t *local_80;
  uint32_t *ctx_r2;
  ulong local_70;
  uint32_t *local_68;
  ulong local_60;
  uint32_t *local_58;
  uint32_t *local_50;
  uint32_t *local_48;
  uint32_t *ctx_n;
  uint32_t *os;
  
  local_70 = CONCAT44(in_register_00000014,bBits);
  uVar2 = k->len;
  uVar17 = (ulong)uVar2;
  local_68 = k->n;
  os._4_4_ = k->mu;
  local_50 = k->r2;
  uVar15 = uVar17 * 4 + 0xf & 0xfffffffffffffff0;
  lVar3 = -uVar15;
  puVar19 = (uint32_t *)((long)auStack_110 + lVar3 + 8);
  __n = uVar17 * 4;
  local_c8 = b;
  ctx_n = resM;
  *(undefined8 *)((long)auStack_110 + lVar3) = 0x141cef;
  memset(puVar19,0,__n);
  *(undefined8 *)((long)auStack_110 + lVar3) = 0x141cfd;
  memcpy(puVar19,aM,__n);
  if ((uint)local_70 < 200) {
    puVar10 = (uint32_t *)((long)puVar19 - ((ulong)(uVar2 * 2) * 4 + 0xf & 0xfffffffffffffff0));
    puVar10[-2] = 0x141d33;
    puVar10[-1] = 0;
    memset(puVar10,0,(ulong)(uVar2 * 2) << 2);
    puVar13 = local_68;
    puVar10[-2] = 0x141d42;
    puVar10[-1] = 0;
    memcpy(puVar10,puVar13,__n);
    puVar13 = local_50;
    puVar10[-2] = 0x141d55;
    puVar10[-1] = 0;
    memcpy(puVar10 + uVar17,puVar13,__n);
    uVar6 = os._4_4_;
    puVar13 = ctx_n;
    local_58 = puVar10;
    puVar10[-2] = 0x141d6e;
    puVar10[-1] = 0;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar2,puVar10,uVar6,puVar10 + uVar17,puVar13);
    uVar6 = os._4_4_;
    puVar1 = ctx_n;
    puVar13 = local_58;
    uVar14 = 0;
    if ((int)local_70 != 0) {
      uVar9 = 0;
      uVar14 = 0;
      do {
        local_48 = (uint32_t *)CONCAT44(local_48._4_4_,uVar9);
        uVar9 = ~uVar9 + (int)local_70;
        uVar9 = (uint)((local_c8[uVar9 >> 5] >> (uVar9 & 0x1f) & 1) != 0);
        if (uVar17 != 0) {
          uVar15 = 0;
          do {
            uVar18 = puVar19[uVar15];
            uVar12 = (uVar18 ^ puVar1[uVar15]) & -(uVar14 ^ uVar9);
            puVar1[uVar15] = puVar1[uVar15] ^ uVar12;
            puVar19[uVar15] = uVar12 ^ uVar18;
            uVar15 = uVar15 + 1;
          } while (uVar17 != uVar15);
        }
        local_60 = CONCAT44(local_60._4_4_,uVar9);
        puVar10[-2] = 0x141df7;
        puVar10[-1] = 0;
        Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar2,puVar13,uVar6,puVar19,puVar1,puVar19);
        puVar10[-2] = 0x141e0b;
        puVar10[-1] = 0;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar2,puVar13,uVar6,puVar1,puVar1);
        uVar9 = (int)local_48 + 1;
        uVar14 = (uint)local_60;
      } while (uVar9 != (uint)local_70);
    }
    if (uVar17 != 0) {
      uVar15 = 0;
      do {
        uVar2 = puVar19[uVar15];
        uVar9 = (uVar2 ^ ctx_n[uVar15]) & -uVar14;
        ctx_n[uVar15] = ctx_n[uVar15] ^ uVar9;
        puVar19[uVar15] = uVar9 ^ uVar2;
        uVar15 = uVar15 + 1;
      } while (uVar17 != uVar15);
    }
  }
  else {
    ctx_r2._4_4_ = (uint)local_70 - 1 >> 5;
    local_60 = (ulong)(uVar2 * 2);
    puVar11 = (uint32_t *)((long)puVar19 - (local_60 * 4 + 0xf & 0xfffffffffffffff0));
    __n_00 = local_60 * 4;
    local_48 = puVar11;
    puVar11[-2] = 0x141e96;
    puVar11[-1] = 0;
    memset(puVar11,0,__n_00);
    puVar13 = local_68;
    puVar11[-2] = 0x141ea5;
    puVar11[-1] = 0;
    memcpy(puVar11,puVar13,__n);
    puVar13 = local_50;
    local_80 = puVar11 + uVar17;
    puVar11[-2] = 0x141eb9;
    puVar11[-1] = 0;
    memcpy(puVar11 + uVar17,puVar13,__n);
    puVar11 = puVar11 + -(ulong)(uVar2 << 4);
    local_50 = puVar11;
    puVar11[-2] = 0x141ed7;
    puVar11[-1] = 0;
    memset(puVar11,0,(ulong)(uVar2 << 4) * 4);
    puVar11 = (uint32_t *)((long)puVar11 - uVar15);
    local_a8 = uVar15;
    local_58 = (uint32_t *)__n;
    puVar11[-2] = 0x141efb;
    puVar11[-1] = 0;
    memset(puVar11,0,__n);
    uVar6 = os._4_4_;
    puVar4 = local_48;
    puVar10 = local_50;
    puVar1 = local_80;
    puVar13 = local_50 + uVar17;
    puVar11[-2] = 0x141f16;
    puVar11[-1] = 0;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar2,puVar4,uVar6,puVar1,puVar10);
    puVar11[-2] = 0x141f24;
    puVar11[-1] = 0;
    memcpy(puVar13,puVar19,__n);
    uVar6 = os._4_4_;
    puVar1 = local_48;
    local_f8 = puVar13;
    puVar11[-2] = 0x141f42;
    puVar11[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar2,puVar1,uVar6,puVar13,puVar11);
    puVar1 = local_58;
    puVar13 = local_50 + local_60;
    puVar11[-2] = 0x141f5d;
    puVar11[-1] = 0;
    memcpy(puVar13,puVar11,(size_t)puVar1);
    puVar1 = local_48;
    puVar11[-2] = 0x141f74;
    puVar11[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar2,puVar1,uVar6,puVar19,puVar13,puVar11);
    puVar10 = local_58;
    local_88 = (uint32_t *)(ulong)(uVar2 * 3);
    puVar1 = local_50 + (long)local_88;
    local_c0 = puVar1;
    puVar11[-2] = 0x141f9a;
    puVar11[-1] = 0;
    memcpy(puVar1,puVar11,(size_t)puVar10);
    uVar6 = os._4_4_;
    puVar1 = local_48;
    local_f0 = puVar13;
    puVar11[-2] = 0x141fb6;
    puVar11[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar2,puVar1,uVar6,puVar13,puVar11);
    puVar1 = local_50;
    local_90 = (uint32_t *)(ulong)(uVar2 * 4);
    puVar13 = local_50 + (long)local_90;
    local_68 = puVar13;
    puVar11[-2] = 0x141fe3;
    puVar11[-1] = 0;
    memcpy(puVar13,puVar11,(size_t)puVar10);
    uVar6 = os._4_4_;
    puVar10 = local_48;
    puVar13 = local_68;
    puVar11[-2] = 0x141ffe;
    puVar11[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar2,puVar10,uVar6,puVar19,puVar13,puVar11);
    puVar13 = local_58;
    local_b8 = puVar1 + uVar2 * 5;
    puVar11[-2] = 0x142020;
    puVar11[-1] = 0;
    memcpy(puVar1 + uVar2 * 5,puVar11,(size_t)puVar13);
    puVar1 = local_48;
    puVar13 = local_c0;
    puVar11[-2] = 0x14203b;
    puVar11[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar2,puVar1,uVar6,puVar13,puVar11);
    puVar10 = local_50;
    puVar1 = local_58;
    puVar13 = local_50 + uVar2 * 6;
    local_a0 = puVar13;
    puVar11[-2] = 0x14205d;
    puVar11[-1] = 0;
    memcpy(puVar13,puVar11,(size_t)puVar1);
    puVar1 = local_48;
    puVar13 = local_a0;
    puVar11[-2] = 0x142079;
    puVar11[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar2,puVar1,uVar6,puVar19,puVar13,puVar11);
    puVar13 = local_58;
    local_98 = (uint32_t *)(ulong)(uVar2 * 8);
    local_b0 = puVar10 + uVar2 * 7;
    puVar11[-2] = 0x1420a2;
    puVar11[-1] = 0;
    memcpy(puVar10 + uVar2 * 7,puVar11,(size_t)puVar13);
    puVar10 = local_48;
    puVar13 = local_68;
    puVar11[-2] = 0x1420bb;
    puVar11[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar2,puVar10,uVar6,puVar13,puVar11);
    puVar1 = local_58;
    puVar13 = local_50 + (long)local_98;
    puVar11[-2] = 0x1420d9;
    puVar11[-1] = 0;
    memcpy(puVar13,puVar11,(size_t)puVar1);
    uVar6 = os._4_4_;
    local_98 = puVar13;
    puVar11[-2] = 0x1420f7;
    puVar11[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar2,puVar10,uVar6,puVar19,puVar13,puVar11);
    puVar1 = local_58;
    puVar13 = local_50 + uVar2 * 9;
    local_e8 = puVar13;
    puVar11[-2] = 0x142119;
    puVar11[-1] = 0;
    memcpy(puVar13,puVar11,(size_t)puVar1);
    uVar6 = os._4_4_;
    puVar10 = local_48;
    puVar13 = local_b8;
    puVar11[-2] = 0x142132;
    puVar11[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar2,puVar10,uVar6,puVar13,puVar11);
    puVar13 = local_50 + (uint)((int)local_60 * 5);
    puVar11[-2] = 0x14214f;
    puVar11[-1] = 0;
    memcpy(puVar13,puVar11,(size_t)puVar1);
    uVar6 = os._4_4_;
    puVar1 = local_48;
    local_e0 = puVar13;
    puVar11[-2] = 0x14216e;
    puVar11[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar2,puVar1,uVar6,puVar19,puVar13,puVar11);
    puVar1 = local_50;
    puVar10 = local_58;
    local_100 = (ulong)(uVar2 * 5);
    puVar13 = local_50 + uVar2 * 0xb;
    local_d8 = puVar13;
    puVar11[-2] = 0x142198;
    puVar11[-1] = 0;
    memcpy(puVar13,puVar11,(size_t)puVar10);
    uVar6 = os._4_4_;
    puVar10 = local_48;
    puVar13 = local_a0;
    puVar11[-2] = 0x1421b1;
    puVar11[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar2,puVar10,uVar6,puVar13,puVar11);
    puVar13 = local_58;
    puVar1 = puVar1 + (uint)((int)local_90 * 3);
    puVar11[-2] = 0x1421ce;
    puVar11[-1] = 0;
    memcpy(puVar1,puVar11,(size_t)puVar13);
    uVar6 = os._4_4_;
    puVar13 = local_48;
    local_90 = puVar1;
    puVar11[-2] = 0x1421ef;
    puVar11[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar2,puVar13,uVar6,puVar19,puVar1,puVar11);
    puVar1 = local_58;
    puVar13 = local_50 + (uVar2 + (int)local_88 * 4);
    local_88 = puVar13;
    puVar11[-2] = 0x14220f;
    puVar11[-1] = 0;
    memcpy(puVar13,puVar11,(size_t)puVar1);
    puVar1 = local_48;
    puVar13 = local_b0;
    puVar11[-2] = 0x142227;
    puVar11[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar2,puVar1,uVar6,puVar13,puVar11);
    puVar1 = local_58;
    puVar13 = local_50 + (uVar2 * 0x10 - (uint)local_60);
    puVar11[-2] = 0x142247;
    puVar11[-1] = 0;
    memcpy(puVar13,puVar11,(size_t)puVar1);
    uVar6 = os._4_4_;
    puVar4 = local_48;
    local_d0 = puVar13;
    puVar11[-2] = 0x142269;
    puVar11[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar2,puVar4,uVar6,puVar19,puVar13,puVar11);
    puVar13 = local_58;
    puVar19 = local_50 + (uint)((int)local_100 * 3);
    puVar11[-2] = 0x14228a;
    puVar11[-1] = 0;
    memcpy(puVar19,puVar11,(size_t)puVar13);
    uVar6 = os._4_4_;
    a = ctx_n;
    puVar10 = local_50;
    puVar1 = local_58;
    puVar13 = local_80;
    if ((local_70 & 3) == 0) {
      puVar11[-2] = 0x142687;
      puVar11[-1] = 0;
      Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar2,puVar4,uVar6,puVar13,a);
    }
    else {
      uVar15 = local_70 >> 5 & 0x7ffffff;
      bVar7 = (byte)local_70 & 0x1c;
      uVar14 = local_c8[uVar15] >> bVar7;
      if ((local_70 & 0x1c) != 0 && (uint)uVar15 < ctx_r2._4_4_) {
        uVar14 = uVar14 | local_c8[uVar15 + 1] << (-bVar7 & 0x1f);
      }
      uVar14 = uVar14 & 0xf;
      puVar11[-2] = 0x1422e6;
      puVar11[-1] = 0;
      memcpy(a,puVar10,(size_t)puVar1);
      puVar11[-2] = 0x1422f3;
      puVar11[-1] = 0;
      uVar5 = FStar_UInt32_eq_mask(uVar14,1);
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          ctx_n[uVar15] = ctx_n[uVar15] & ~uVar5 | local_f8[uVar15] & uVar5;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x142330;
      puVar11[-1] = 0;
      uVar5 = FStar_UInt32_eq_mask(uVar14,2);
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          ctx_n[uVar15] = ctx_n[uVar15] & ~uVar5 | local_f0[uVar15] & uVar5;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x14236d;
      puVar11[-1] = 0;
      uVar5 = FStar_UInt32_eq_mask(uVar14,3);
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          ctx_n[uVar15] = ctx_n[uVar15] & ~uVar5 | local_c0[uVar15] & uVar5;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x1423aa;
      puVar11[-1] = 0;
      uVar5 = FStar_UInt32_eq_mask(uVar14,4);
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          ctx_n[uVar15] = ctx_n[uVar15] & ~uVar5 | local_68[uVar15] & uVar5;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x1423e4;
      puVar11[-1] = 0;
      uVar5 = FStar_UInt32_eq_mask(uVar14,5);
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          ctx_n[uVar15] = ctx_n[uVar15] & ~uVar5 | local_b8[uVar15] & uVar5;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x142421;
      puVar11[-1] = 0;
      uVar5 = FStar_UInt32_eq_mask(uVar14,6);
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          ctx_n[uVar15] = ctx_n[uVar15] & ~uVar5 | local_a0[uVar15] & uVar5;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x14245e;
      puVar11[-1] = 0;
      uVar5 = FStar_UInt32_eq_mask(uVar14,7);
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          ctx_n[uVar15] = ctx_n[uVar15] & ~uVar5 | local_b0[uVar15] & uVar5;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x14249b;
      puVar11[-1] = 0;
      uVar5 = FStar_UInt32_eq_mask(uVar14,8);
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          ctx_n[uVar15] = ctx_n[uVar15] & ~uVar5 | local_98[uVar15] & uVar5;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x1424d8;
      puVar11[-1] = 0;
      uVar5 = FStar_UInt32_eq_mask(uVar14,9);
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          ctx_n[uVar15] = ctx_n[uVar15] & ~uVar5 | local_e8[uVar15] & uVar5;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x142515;
      puVar11[-1] = 0;
      uVar5 = FStar_UInt32_eq_mask(uVar14,10);
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          ctx_n[uVar15] = ctx_n[uVar15] & ~uVar5 | local_e0[uVar15] & uVar5;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x142552;
      puVar11[-1] = 0;
      uVar5 = FStar_UInt32_eq_mask(uVar14,0xb);
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          ctx_n[uVar15] = ctx_n[uVar15] & ~uVar5 | local_d8[uVar15] & uVar5;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x14258f;
      puVar11[-1] = 0;
      uVar5 = FStar_UInt32_eq_mask(uVar14,0xc);
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          ctx_n[uVar15] = ctx_n[uVar15] & ~uVar5 | local_90[uVar15] & uVar5;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x1425cc;
      puVar11[-1] = 0;
      uVar5 = FStar_UInt32_eq_mask(uVar14,0xd);
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          ctx_n[uVar15] = ctx_n[uVar15] & ~uVar5 | local_88[uVar15] & uVar5;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x142606;
      puVar11[-1] = 0;
      uVar5 = FStar_UInt32_eq_mask(uVar14,0xe);
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          ctx_n[uVar15] = ctx_n[uVar15] & ~uVar5 | local_d0[uVar15] & uVar5;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x142643;
      puVar11[-1] = 0;
      uVar5 = FStar_UInt32_eq_mask(uVar14,0xf);
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          ctx_n[uVar15] = ctx_n[uVar15] & ~uVar5 | puVar19[uVar15] & uVar5;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
    }
    puVar13 = local_58;
    puVar11 = (uint32_t *)((long)puVar11 - local_a8);
    uVar16 = 0;
    local_80 = puVar19;
    puVar11[-2] = 0x1426a9;
    puVar11[-1] = 0;
    memset(puVar11,0,(size_t)puVar13);
    uVar15 = local_70 >> 2;
    local_70 = (ulong)((uint)local_70 & 0xfffffffc);
    local_a8 = CONCAT44(local_a8._4_4_,
                        ((uint)uVar15 & 0x3fffffff) + (uint)((uVar15 & 0x3fffffff) == 0));
    puVar13 = ctx_n;
    puVar19 = local_48;
    do {
      local_60 = uVar16;
      puVar11[-2] = 0x1426e4;
      puVar11[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar2,puVar19,uVar6,puVar13,puVar13);
      puVar11[-2] = 0x1426f7;
      puVar11[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar2,puVar19,uVar6,puVar13,puVar13);
      puVar11[-2] = 0x14270a;
      puVar11[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar2,puVar19,uVar6,puVar13,puVar13);
      puVar11[-2] = 0x14271d;
      puVar11[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar2,puVar19,uVar6,puVar13,puVar13);
      puVar13 = local_50;
      puVar19 = local_58;
      uVar9 = ((int)local_70 + (int)local_60 * -4) - 4;
      uVar14 = uVar9 >> 5;
      uVar9 = uVar9 & 0x1c;
      sVar8 = (sbyte)uVar9;
      uVar18 = local_c8[uVar14] >> sVar8;
      if (uVar9 != 0 && uVar14 < ctx_r2._4_4_) {
        uVar18 = uVar18 | local_c8[(ulong)uVar14 + 1] << (-sVar8 & 0x1fU);
      }
      uVar18 = uVar18 & 0xf;
      puVar11[-2] = 0x142779;
      puVar11[-1] = 0;
      memcpy(puVar11,puVar13,(size_t)puVar19);
      puVar11[-2] = 0x142786;
      puVar11[-1] = 0;
      uVar6 = FStar_UInt32_eq_mask(uVar18,1);
      puVar13 = local_80;
      puVar19 = local_f8;
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          puVar11[uVar15] = puVar11[uVar15] & ~uVar6 | puVar19[uVar15] & uVar6;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x1427c3;
      puVar11[-1] = 0;
      uVar6 = FStar_UInt32_eq_mask(uVar18,2);
      puVar19 = local_f0;
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          puVar11[uVar15] = puVar11[uVar15] & ~uVar6 | puVar19[uVar15] & uVar6;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x1427fc;
      puVar11[-1] = 0;
      uVar6 = FStar_UInt32_eq_mask(uVar18,3);
      puVar19 = local_c0;
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          puVar11[uVar15] = puVar11[uVar15] & ~uVar6 | puVar19[uVar15] & uVar6;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x142835;
      puVar11[-1] = 0;
      uVar6 = FStar_UInt32_eq_mask(uVar18,4);
      puVar19 = local_68;
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          puVar11[uVar15] = puVar11[uVar15] & ~uVar6 | puVar19[uVar15] & uVar6;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x14286b;
      puVar11[-1] = 0;
      uVar6 = FStar_UInt32_eq_mask(uVar18,5);
      puVar19 = local_b8;
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          puVar11[uVar15] = puVar11[uVar15] & ~uVar6 | puVar19[uVar15] & uVar6;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x1428a4;
      puVar11[-1] = 0;
      uVar6 = FStar_UInt32_eq_mask(uVar18,6);
      puVar19 = local_a0;
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          puVar11[uVar15] = puVar11[uVar15] & ~uVar6 | puVar19[uVar15] & uVar6;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x1428dd;
      puVar11[-1] = 0;
      uVar6 = FStar_UInt32_eq_mask(uVar18,7);
      puVar19 = local_b0;
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          puVar11[uVar15] = puVar11[uVar15] & ~uVar6 | puVar19[uVar15] & uVar6;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x142916;
      puVar11[-1] = 0;
      uVar6 = FStar_UInt32_eq_mask(uVar18,8);
      puVar19 = local_98;
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          puVar11[uVar15] = puVar11[uVar15] & ~uVar6 | puVar19[uVar15] & uVar6;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x14294f;
      puVar11[-1] = 0;
      uVar6 = FStar_UInt32_eq_mask(uVar18,9);
      puVar19 = local_e8;
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          puVar11[uVar15] = puVar11[uVar15] & ~uVar6 | puVar19[uVar15] & uVar6;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x142988;
      puVar11[-1] = 0;
      uVar6 = FStar_UInt32_eq_mask(uVar18,10);
      puVar19 = local_e0;
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          puVar11[uVar15] = puVar11[uVar15] & ~uVar6 | puVar19[uVar15] & uVar6;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x1429c1;
      puVar11[-1] = 0;
      uVar6 = FStar_UInt32_eq_mask(uVar18,0xb);
      puVar19 = local_d8;
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          puVar11[uVar15] = puVar11[uVar15] & ~uVar6 | puVar19[uVar15] & uVar6;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x1429fa;
      puVar11[-1] = 0;
      uVar6 = FStar_UInt32_eq_mask(uVar18,0xc);
      puVar19 = local_90;
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          puVar11[uVar15] = puVar11[uVar15] & ~uVar6 | puVar19[uVar15] & uVar6;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x142a33;
      puVar11[-1] = 0;
      uVar6 = FStar_UInt32_eq_mask(uVar18,0xd);
      puVar19 = local_88;
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          puVar11[uVar15] = puVar11[uVar15] & ~uVar6 | puVar19[uVar15] & uVar6;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x142a69;
      puVar11[-1] = 0;
      uVar6 = FStar_UInt32_eq_mask(uVar18,0xe);
      puVar19 = local_d0;
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          puVar11[uVar15] = puVar11[uVar15] & ~uVar6 | puVar19[uVar15] & uVar6;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      puVar11[-2] = 0x142aa2;
      puVar11[-1] = 0;
      uVar6 = FStar_UInt32_eq_mask(uVar18,0xf);
      if (uVar17 != 0) {
        uVar15 = 0;
        do {
          puVar11[uVar15] = puVar11[uVar15] & ~uVar6 | puVar13[uVar15] & uVar6;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      uVar6 = os._4_4_;
      puVar13 = ctx_n;
      puVar19 = local_48;
      puVar11[-2] = 0x142ae9;
      puVar11[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar2,puVar19,uVar6,puVar13,puVar11,puVar13);
      uVar14 = (int)local_60 + 1;
      uVar16 = (ulong)uVar14;
    } while (uVar14 != (uint)local_a8);
  }
  return;
}

Assistant:

void
Hacl_GenericField32_exp_consttime(
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,
  uint32_t *aM,
  uint32_t bBits,
  uint32_t *b,
  uint32_t *resM
)
{
  uint32_t len1 = Hacl_GenericField32_field_get_len(k);
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k1 = *k;
  KRML_CHECK_SIZE(sizeof (uint32_t), k1.len);
  uint32_t aMc[k1.len];
  memset(aMc, 0U, k1.len * sizeof (uint32_t));
  memcpy(aMc, aM, k1.len * sizeof (uint32_t));
  if (bBits < 200U)
  {
    KRML_CHECK_SIZE(sizeof (uint32_t), len1 + len1);
    uint32_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint32_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint32_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint32_t));
    uint32_t sw = 0U;
    uint32_t *ctx_n = ctx;
    uint32_t *ctx_r2 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n, k1.mu, ctx_r2, resM);
    for (uint32_t i0 = 0U; i0 < bBits; i0++)
    {
      uint32_t i1 = (bBits - i0 - 1U) / 32U;
      uint32_t j = (bBits - i0 - 1U) % 32U;
      uint32_t tmp = b[i1];
      uint32_t bit = tmp >> j & 1U;
      uint32_t sw1 = bit ^ sw;
      for (uint32_t i = 0U; i < len1; i++)
      {
        uint32_t dummy = (0U - sw1) & (resM[i] ^ aMc[i]);
        resM[i] = resM[i] ^ dummy;
        aMc[i] = aMc[i] ^ dummy;
      }
      uint32_t *ctx_n0 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n0, k1.mu, aMc, resM, aMc);
      uint32_t *ctx_n1 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n1, k1.mu, resM, resM);
      sw = bit;
    }
    uint32_t sw0 = sw;
    for (uint32_t i = 0U; i < len1; i++)
    {
      uint32_t dummy = (0U - sw0) & (resM[i] ^ aMc[i]);
      resM[i] = resM[i] ^ dummy;
      aMc[i] = aMc[i] ^ dummy;
    }
  }
  else
  {
    uint32_t bLen;
    if (bBits == 0U)
    {
      bLen = 1U;
    }
    else
    {
      bLen = (bBits - 1U) / 32U + 1U;
    }
    KRML_CHECK_SIZE(sizeof (uint32_t), len1 + len1);
    uint32_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint32_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint32_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint32_t));
    KRML_CHECK_SIZE(sizeof (uint32_t), 16U * len1);
    uint32_t table[16U * len1];
    memset(table, 0U, 16U * len1 * sizeof (uint32_t));
    KRML_CHECK_SIZE(sizeof (uint32_t), len1);
    uint32_t tmp[len1];
    memset(tmp, 0U, len1 * sizeof (uint32_t));
    uint32_t *t0 = table;
    uint32_t *t1 = table + len1;
    uint32_t *ctx_n0 = ctx;
    uint32_t *ctx_r20 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n0, k1.mu, ctx_r20, t0);
    memcpy(t1, aMc, len1 * sizeof (uint32_t));
    KRML_MAYBE_FOR7(i,
      0U,
      7U,
      1U,
      uint32_t *t11 = table + (i + 1U) * len1;
      uint32_t *ctx_n1 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n1, k1.mu, t11, tmp);
      memcpy(table + (2U * i + 2U) * len1, tmp, len1 * sizeof (uint32_t));
      uint32_t *t2 = table + (2U * i + 2U) * len1;
      uint32_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n, k1.mu, aMc, t2, tmp);
      memcpy(table + (2U * i + 3U) * len1, tmp, len1 * sizeof (uint32_t)););
    if (bBits % 4U != 0U)
    {
      uint32_t i0 = bBits / 4U * 4U;
      uint32_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, i0, 4U);
      memcpy(resM, (uint32_t *)(table + 0U * len1), len1 * sizeof (uint32_t));
      KRML_MAYBE_FOR15(i1,
        0U,
        15U,
        1U,
        uint32_t c = FStar_UInt32_eq_mask(bits_c, i1 + 1U);
        const uint32_t *res_j = table + (i1 + 1U) * len1;
        for (uint32_t i = 0U; i < len1; i++)
        {
          uint32_t *os = resM;
          uint32_t x = (c & res_j[i]) | (~c & resM[i]);
          os[i] = x;
        });
    }
    else
    {
      uint32_t *ctx_n = ctx;
      uint32_t *ctx_r2 = ctx + len1;
      Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n, k1.mu, ctx_r2, resM);
    }
    KRML_CHECK_SIZE(sizeof (uint32_t), len1);
    uint32_t tmp0[len1];
    memset(tmp0, 0U, len1 * sizeof (uint32_t));
    for (uint32_t i0 = 0U; i0 < bBits / 4U; i0++)
    {
      KRML_MAYBE_FOR4(i,
        0U,
        4U,
        1U,
        uint32_t *ctx_n = ctx;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n, k1.mu, resM, resM););
      uint32_t k2 = bBits - bBits % 4U - 4U * i0 - 4U;
      uint32_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, k2, 4U);
      memcpy(tmp0, (uint32_t *)(table + 0U * len1), len1 * sizeof (uint32_t));
      KRML_MAYBE_FOR15(i1,
        0U,
        15U,
        1U,
        uint32_t c = FStar_UInt32_eq_mask(bits_l, i1 + 1U);
        const uint32_t *res_j = table + (i1 + 1U) * len1;
        for (uint32_t i = 0U; i < len1; i++)
        {
          uint32_t *os = tmp0;
          uint32_t x = (c & res_j[i]) | (~c & tmp0[i]);
          os[i] = x;
        });
      uint32_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n, k1.mu, resM, tmp0, resM);
    }
  }
}